

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O3

int __thiscall Problem::getStateConflicts(Problem *this,vector<int,_std::allocator<int>_> *bidNos)

{
  int iVar1;
  pointer piVar2;
  vector<node,_std::allocator<node>_> *pvVar3;
  pointer pnVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  vector<int,_std::allocator<int>_> conflictArray;
  allocator_type local_3d;
  value_type_conflict local_3c;
  vector<int,_std::allocator<int>_> local_38;
  
  local_3c = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_38,(long)this->numRegions,&local_3c,&local_3d);
  iVar7 = this->numCompanies;
  if (iVar7 < 1) {
    iVar6 = 0;
  }
  else {
    piVar2 = (bidNos->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    pvVar3 = this->problemData;
    lVar5 = 0;
    iVar6 = 0;
    do {
      iVar1 = piVar2[lVar5];
      pnVar4 = pvVar3[lVar5].super__Vector_base<node,_std::allocator<node>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = (long)pnVar4[iVar1].norc;
      if (0 < lVar9) {
        lVar8 = 0;
        do {
          iVar7 = pnVar4[iVar1].region[lVar8];
          if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[iVar7] == 0) {
            local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar7] = 1;
          }
          else {
            iVar6 = iVar6 + 1;
          }
          lVar8 = lVar8 + 1;
        } while (lVar9 != lVar8);
        iVar7 = this->numCompanies;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar7);
  }
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return iVar6;
}

Assistant:

int Problem::getStateConflicts(vector<int> bidNos) {
    vector<int> conflictArray(this->numRegions, 0);
    int totalConflicts = 0;
    for (int i = 0; i < this->numCompanies; i++) {
        int curBidNumber = bidNos[i];
        // cout<<"Current bid no.: "<<curBidNumber<<endl;
        int *curRegions = this->problemData[i][curBidNumber].region;
        int curRegionsSize = this->problemData[i][curBidNumber].norc;
        // cout<<"Region size: "<<curRegionsSize<<endl;
        for (int j = 0; j < curRegionsSize; j++) {
            if (conflictArray[curRegions[j]] != 0) {
                totalConflicts++;
            }
            else {
                conflictArray[curRegions[j]] = 1;
            }
        }
    }
    // cout<<"Conflicts found: "<<totalConflicts<<endl;
    return totalConflicts;
}